

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O3

void __thiscall cfd::CoinSelectionOption::InitializeTxSizeInfo(CoinSelectionOption *this)

{
  Script SVar1;
  uint32_t uVar2;
  TxOut txout;
  TxOutReference txout_ref;
  Script wpkh_script;
  undefined8 in_stack_fffffffffffffed8;
  undefined1 *puVar3;
  undefined1 in_stack_fffffffffffffee8 [40];
  undefined **local_d0 [3];
  Script local_b8;
  Script local_80;
  Script local_48;
  
  puVar3 = &stack0xfffffffffffffef0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&stack0xfffffffffffffee0,"0014ffffffffffffffffffffffffffffffffffffffff","");
  cfd::core::Script::Script(&local_48,(string *)&stack0xfffffffffffffee0);
  if (puVar3 != &stack0xfffffffffffffef0) {
    operator_delete(puVar3);
  }
  cfd::core::Amount::Amount((Amount *)local_d0);
  cfd::core::TxOut::TxOut((TxOut *)&stack0xfffffffffffffee0,(Amount *)local_d0,&local_48);
  cfd::core::TxOutReference::TxOutReference
            ((TxOutReference *)local_d0,(TxOut *)&stack0xfffffffffffffee0);
  uVar2 = cfd::core::AbstractTxOutReference::GetSerializeVsize();
  this->change_output_size_ = uVar2;
  cfd::core::Script::Script(&local_80);
  SVar1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_start = puVar3;
  SVar1._vptr_Script = (_func_int **)in_stack_fffffffffffffed8;
  SVar1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_finish = (pointer)in_stack_fffffffffffffee8._0_8_;
  SVar1.script_data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
  .super__Vector_impl_data._M_end_of_storage = (pointer)in_stack_fffffffffffffee8._8_8_;
  SVar1.script_stack_.
  super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>._M_impl.
  super__Vector_impl_data =
       (_Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)
       (_Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>)
       in_stack_fffffffffffffee8._16_24_;
  uVar2 = cfd::core::TxIn::EstimateTxInVsize(kP2wpkhAddress,SVar1,&local_80);
  this->change_spend_size_ = uVar2;
  core::Script::~Script(&local_80);
  local_d0[0] = &PTR__AbstractTxOutReference_002b1160;
  core::Script::~Script(&local_b8);
  core::Script::~Script((Script *)&stack0xfffffffffffffef8);
  core::Script::~Script(&local_48);
  return;
}

Assistant:

void CoinSelectionOption::InitializeTxSizeInfo() {
  // wpkh想定
  Script wpkh_script("0014ffffffffffffffffffffffffffffffffffffffff");
  TxOut txout(Amount(), wpkh_script);
  TxOutReference txout_ref(txout);
  change_output_size_ = txout_ref.GetSerializeVsize();
  change_spend_size_ =
      TxIn::EstimateTxInVsize(AddressType::kP2wpkhAddress, Script());
}